

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLElement::Accept(XMLElement *this,XMLVisitor *visitor)

{
  uint uVar1;
  int iVar2;
  XMLNode *local_20;
  XMLNode *node;
  XMLVisitor *visitor_local;
  XMLElement *this_local;
  
  uVar1 = (*visitor->_vptr_XMLVisitor[4])(visitor,this,this->_rootAttribute);
  if ((uVar1 & 1) != 0) {
    local_20 = XMLNode::FirstChild(&this->super_XMLNode);
    while ((local_20 != (XMLNode *)0x0 &&
           (uVar1 = (*local_20->_vptr_XMLNode[0xe])(local_20,visitor), (uVar1 & 1) != 0))) {
      local_20 = XMLNode::NextSibling(local_20);
    }
  }
  iVar2 = (*visitor->_vptr_XMLVisitor[5])(visitor,this);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool XMLElement::Accept( XMLVisitor* visitor ) const
{
    TIXMLASSERT( visitor );
    if ( visitor->VisitEnter( *this, _rootAttribute ) ) {
        for ( const XMLNode* node=FirstChild(); node; node=node->NextSibling() ) {
            if ( !node->Accept( visitor ) ) {
                break;
            }
        }
    }
    return visitor->VisitExit( *this );
}